

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

void __thiscall
wabt::interp::Istream::Disassemble(Istream *this,Stream *stream,Offset from,Offset to)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  uint local_2c;
  Offset pc;
  DisassemblySource source;
  Offset to_local;
  Offset from_local;
  Stream *stream_local;
  Istream *this_local;
  
  source.super_TraceSource._vptr_TraceSource._0_4_ = to;
  source.super_TraceSource._vptr_TraceSource._4_4_ = from;
  DisassemblySource::DisassemblySource((DisassemblySource *)&stack0xffffffffffffffd8);
  uVar2 = (ulong)source.super_TraceSource._vptr_TraceSource._4_4_;
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
  bVar1 = false;
  if (uVar2 <= sVar3) {
    uVar2 = (ulong)(Offset)source.super_TraceSource._vptr_TraceSource;
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data_);
    bVar1 = false;
    if (uVar2 <= sVar3) {
      bVar1 = source.super_TraceSource._vptr_TraceSource._4_4_ <=
              (Offset)source.super_TraceSource._vptr_TraceSource;
    }
  }
  if (!bVar1) {
    __assert_fail("from <= data_.size() && to <= data_.size() && from <= to",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/istream.cc"
                  ,0x336,"void wabt::interp::Istream::Disassemble(Stream *, Offset, Offset) const");
  }
  for (local_2c = source.super_TraceSource._vptr_TraceSource._4_4_;
      local_2c < (Offset)source.super_TraceSource._vptr_TraceSource;
      local_2c = Trace(this,stream,local_2c,(TraceSource *)&stack0xffffffffffffffd8)) {
  }
  DisassemblySource::~DisassemblySource((DisassemblySource *)&stack0xffffffffffffffd8);
  return;
}

Assistant:

void Istream::Disassemble(Stream* stream, Offset from, Offset to) const {
  DisassemblySource source;
  assert(from <= data_.size() && to <= data_.size() && from <= to);

  Offset pc = from;
  while (pc < to) {
    pc = Trace(stream, pc, &source);
  }
}